

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_Serialization_Test<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Serialization_Test<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  undefined8 *puVar1;
  bool bVar2;
  FILE *__stream;
  int i;
  int index;
  char *pcVar3;
  char *in_R9;
  internal iVar4;
  pair<unsigned_long,_unsigned_long> pVar5;
  pair<const_std::pair<int,_int>,_int> pVar6;
  TypeParam ht_in;
  TypeParam ht_out;
  Hasher local_180;
  undefined1 local_170 [8];
  undefined8 *local_168;
  pair<int,_int> local_160;
  string local_158;
  undefined1 local_138 [8];
  pointer local_130;
  undefined1 local_128 [112];
  pointer local_b8;
  HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_b0;
  
  local_158._M_dataplus._M_p._0_4_ = 0;
  local_158._M_dataplus._M_p._4_4_ = 0;
  local_158._M_string_length._0_4_ = 0;
  local_170 = (undefined1  [8])0x0;
  local_168 = (undefined8 *)((ulong)local_168 & 0xffffffff00000000);
  local_138 = (undefined1  [8])((ulong)local_138 & 0xffffffff00000000);
  local_130 = (pointer)0x0;
  google::
  HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            (&local_b0,0,(hasher *)&local_158,(key_equal *)local_170,(allocator_type *)local_138);
  pVar6 = UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(2000);
  this_00 = &local_b0.
             super_BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  google::
  dense_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&this_00->rep);
  local_b0.
  super_BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.rep.settings.
  super_sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>.use_deleted_
       = true;
  local_b0.
  super_BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.rep.key_info.delkey.first = pVar6.first.first;
  local_b0.
  super_BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.rep.key_info.delkey.second = pVar6.first.second;
  index = 1;
  do {
    pVar6 = UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(index);
    local_158._M_dataplus._M_p._0_4_ = pVar6.first.first;
    local_158._M_dataplus._M_p._4_4_ = pVar6.first.second;
    local_158._M_string_length._0_4_ = pVar6.second;
    google::
    dense_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(&this_00->rep,1);
    google::
    dense_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
    ::insert_noresize<std::pair<int,int>const&,std::pair<std::pair<int,int>const,int>const&>
              ((pair<google::dense_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                *)local_138,
               (dense_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                *)this_00,(pair<int,_int> *)&local_158,
               (pair<const_std::pair<int,_int>,_int> *)&local_158);
    index = index + 1;
  } while (index != 100);
  pVar6 = UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(0x38);
  local_138 = (undefined1  [8])pVar6.first;
  google::
  dense_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase(&this_00->rep,(key_type *)local_138);
  pVar6 = UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(0x16);
  local_138 = (undefined1  [8])pVar6.first;
  google::
  dense_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase(&this_00->rep,(key_type *)local_138);
  __stream = tmpfile();
  iVar4 = (internal)(__stream != (FILE *)0x0);
  local_158._M_string_length._0_4_ = 0;
  local_158._M_string_length._4_4_ = 0;
  local_158._M_dataplus._M_p._0_1_ = iVar4;
  if (!(bool)iVar4) {
    testing::Message::Message((Message *)local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_138,(internal *)&local_158,(AssertionResult *)"fp != __null","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4b8,(char *)local_138);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_180,(Message *)local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_180);
    if (local_138 != (undefined1  [8])local_128) {
      operator_delete((void *)local_138);
    }
    if (local_170 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_170 + 8))();
    }
    puVar1 = (undefined8 *)
             CONCAT44(local_158._M_string_length._4_4_,(int)local_158._M_string_length);
    if (puVar1 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar1 != puVar1 + 2) {
        operator_delete((undefined8 *)*puVar1);
      }
      operator_delete(puVar1);
    }
  }
  bVar2 = google::
          dense_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          ::serialize<ValueSerializer,_IO_FILE>
                    ((dense_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)this_00);
  local_158._M_dataplus._M_p._0_4_ = CONCAT31(local_158._M_dataplus._M_p._1_3_,bVar2);
  local_158._M_string_length._0_4_ = 0;
  local_158._M_string_length._4_4_ = 0;
  if (!bVar2) {
    testing::Message::Message((Message *)local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_138,(internal *)&local_158,
               (AssertionResult *)"ht_out.serialize(ValueSerializer(), fp)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4b9,(char *)local_138);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_180,(Message *)local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_180);
    if (local_138 != (undefined1  [8])local_128) {
      operator_delete((void *)local_138);
    }
    if (local_170 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_170 + 8))();
    }
    puVar1 = (undefined8 *)
             CONCAT44(local_158._M_string_length._4_4_,(int)local_158._M_string_length);
    if (puVar1 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar1 != puVar1 + 2) {
        operator_delete((undefined8 *)*puVar1);
      }
      operator_delete(puVar1);
    }
  }
  rewind(__stream);
  local_170 = (undefined1  [8])0x0;
  local_168 = (undefined8 *)((ulong)local_168 & 0xffffffff00000000);
  local_180 = (Hasher)ZEXT812(0);
  local_158._M_dataplus._M_p._0_4_ = 0;
  local_158._M_string_length._0_4_ = 0;
  local_158._M_string_length._4_4_ = 0;
  google::
  HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_138,0,(hasher *)local_170,(key_equal *)&local_180,(allocator_type *)&local_158
            );
  local_168 = (undefined8 *)0x0;
  local_170[0] = iVar4;
  if (__stream == (FILE *)0x0) {
    testing::Message::Message((Message *)&local_180);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_158,(internal *)local_170,(AssertionResult *)"fp != __null","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4bd,(char *)CONCAT44(local_158._M_dataplus._M_p._4_4_,
                                       (int)local_158._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_160,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_158._M_dataplus._M_p._4_4_,(int)local_158._M_dataplus._M_p) !=
        &local_158.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_158._M_dataplus._M_p._4_4_,(int)local_158._M_dataplus._M_p));
    }
    if ((long *)local_180._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_180._0_8_ + 8))();
    }
    puVar1 = local_168;
    if (local_168 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_168 != local_168 + 2) {
        operator_delete((undefined8 *)*local_168);
      }
      operator_delete(puVar1);
    }
  }
  local_170[0] = (internal)
                 google::
                 dense_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                 ::unserialize<ValueSerializer,_IO_FILE>
                           ((dense_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                             *)&local_130,__stream);
  local_168 = (undefined8 *)0x0;
  if (!(bool)local_170[0]) {
    testing::Message::Message((Message *)&local_180);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_158,(internal *)local_170,
               (AssertionResult *)"ht_in.unserialize(ValueSerializer(), fp)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4be,(char *)CONCAT44(local_158._M_dataplus._M_p._4_4_,
                                       (int)local_158._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_160,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_158._M_dataplus._M_p._4_4_,(int)local_158._M_dataplus._M_p) !=
        &local_158.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_158._M_dataplus._M_p._4_4_,(int)local_158._M_dataplus._M_p));
    }
    if ((long *)local_180._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_180._0_8_ + 8))();
    }
    puVar1 = local_168;
    if (local_168 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_168 != local_168 + 2) {
        operator_delete((undefined8 *)*local_168);
      }
      operator_delete(puVar1);
    }
  }
  fclose(__stream);
  local_180 = (Hasher)UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(1);
  pVar6 = UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(1);
  local_160 = pVar6.first;
  google::
  dense_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::find<std::pair<int,int>>
            ((iterator *)&local_158,
             (dense_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
              *)&local_130,&local_160);
  local_158.field_2._8_8_ =
       (HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)local_138;
  testing::internal::
  CmpHelperEQ<std::pair<std::pair<int,int>const,int>,std::pair<std::pair<int,int>const,int>>
            ((internal *)local_170,"this->UniqueObject(1)","*ht_in.find(this->UniqueKey(1))",
             (pair<const_std::pair<int,_int>,_int> *)&local_180,
             (pair<const_std::pair<int,_int>,_int> *)
             CONCAT44(local_158._M_string_length._4_4_,(int)local_158._M_string_length));
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_158);
    if (local_168 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_180,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_180);
    if ((long *)CONCAT44(local_158._M_dataplus._M_p._4_4_,(int)local_158._M_dataplus._M_p) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_158._M_dataplus._M_p._4_4_,
                                     (int)local_158._M_dataplus._M_p) + 8))();
    }
  }
  puVar1 = local_168;
  if (local_168 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_168 != local_168 + 2) {
      operator_delete((undefined8 *)*local_168);
    }
    operator_delete(puVar1);
  }
  local_180 = (Hasher)UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(99);
  pVar6 = UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(99);
  local_160 = pVar6.first;
  google::
  dense_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::find<std::pair<int,int>>
            ((iterator *)&local_158,
             (dense_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
              *)&local_130,&local_160);
  local_158.field_2._8_8_ =
       (HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)local_138;
  testing::internal::
  CmpHelperEQ<std::pair<std::pair<int,int>const,int>,std::pair<std::pair<int,int>const,int>>
            ((internal *)local_170,"this->UniqueObject(99)","*ht_in.find(this->UniqueKey(99))",
             (pair<const_std::pair<int,_int>,_int> *)&local_180,
             (pair<const_std::pair<int,_int>,_int> *)
             CONCAT44(local_158._M_string_length._4_4_,(int)local_158._M_string_length));
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_158);
    if (local_168 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_180,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_180);
    if ((long *)CONCAT44(local_158._M_dataplus._M_p._4_4_,(int)local_158._M_dataplus._M_p) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_158._M_dataplus._M_p._4_4_,
                                     (int)local_158._M_dataplus._M_p) + 8))();
    }
  }
  puVar1 = local_168;
  if (local_168 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_168 != local_168 + 2) {
      operator_delete((undefined8 *)*local_168);
    }
    operator_delete(puVar1);
  }
  pVar6 = UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(100);
  local_158._M_dataplus._M_p._0_4_ = pVar6.first.first;
  local_158._M_dataplus._M_p._4_4_ = pVar6.first.second;
  pVar5 = google::
          dense_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          ::find_position<std::pair<int,int>>
                    ((dense_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)&local_130,(pair<int,_int> *)&local_158);
  bVar2 = pVar5.first == 0xffffffffffffffff;
  local_170[0] = (internal)bVar2;
  local_168 = (undefined8 *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_180);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_158,(internal *)local_170,
               (AssertionResult *)"ht_in.count(this->UniqueKey(100))","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c3,(char *)CONCAT44(local_158._M_dataplus._M_p._4_4_,
                                       (int)local_158._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_160,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_158._M_dataplus._M_p._4_4_,(int)local_158._M_dataplus._M_p) !=
        &local_158.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_158._M_dataplus._M_p._4_4_,(int)local_158._M_dataplus._M_p));
    }
    if ((pair<int,_int>)local_180._0_8_ != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_180._0_8_ + 8))();
    }
    puVar1 = local_168;
    if (local_168 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_168 != local_168 + 2) {
        operator_delete((undefined8 *)*local_168);
      }
      operator_delete(puVar1);
    }
  }
  local_180 = (Hasher)UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(0x15);
  pVar6 = UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(0x15);
  local_160 = pVar6.first;
  google::
  dense_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::find<std::pair<int,int>>
            ((iterator *)&local_158,
             (dense_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
              *)&local_130,&local_160);
  local_158.field_2._8_8_ =
       (HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)local_138;
  testing::internal::
  CmpHelperEQ<std::pair<std::pair<int,int>const,int>,std::pair<std::pair<int,int>const,int>>
            ((internal *)local_170,"this->UniqueObject(21)","*ht_in.find(this->UniqueKey(21))",
             (pair<const_std::pair<int,_int>,_int> *)&local_180,
             (pair<const_std::pair<int,_int>,_int> *)
             CONCAT44(local_158._M_string_length._4_4_,(int)local_158._M_string_length));
  if (local_170[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_158);
    if (local_168 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_168;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_180,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_180);
    if ((long *)CONCAT44(local_158._M_dataplus._M_p._4_4_,(int)local_158._M_dataplus._M_p) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_158._M_dataplus._M_p._4_4_,
                                     (int)local_158._M_dataplus._M_p) + 8))();
    }
  }
  puVar1 = local_168;
  if (local_168 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_168 != local_168 + 2) {
      operator_delete((undefined8 *)*local_168);
    }
    operator_delete(puVar1);
  }
  pVar6 = UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(0x16);
  local_158._M_dataplus._M_p._0_4_ = pVar6.first.first;
  local_158._M_dataplus._M_p._4_4_ = pVar6.first.second;
  pVar5 = google::
          dense_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          ::find_position<std::pair<int,int>>
                    ((dense_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)&local_130,(pair<int,_int> *)&local_158);
  iVar4 = (internal)(pVar5.first == 0xffffffffffffffff);
  local_168 = (undefined8 *)0x0;
  local_170[0] = iVar4;
  if (!(bool)iVar4) {
    testing::Message::Message((Message *)&local_180);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_158,(internal *)local_170,
               (AssertionResult *)"ht_in.count(this->UniqueKey(22))","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c6,(char *)CONCAT44(local_158._M_dataplus._M_p._4_4_,
                                       (int)local_158._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_160,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_158._M_dataplus._M_p._4_4_,(int)local_158._M_dataplus._M_p) !=
        &local_158.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_158._M_dataplus._M_p._4_4_,(int)local_158._M_dataplus._M_p));
    }
    if ((pair<int,_int>)local_180._0_8_ != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_180._0_8_ + 8))();
    }
    puVar1 = local_168;
    if (local_168 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_168 != local_168 + 2) {
        operator_delete((undefined8 *)*local_168);
      }
      operator_delete(puVar1);
    }
  }
  pVar6 = UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(0x38);
  local_158._M_dataplus._M_p._0_4_ = pVar6.first.first;
  local_158._M_dataplus._M_p._4_4_ = pVar6.first.second;
  pVar5 = google::
          dense_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          ::find_position<std::pair<int,int>>
                    ((dense_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)&local_130,(pair<int,_int> *)&local_158);
  local_170[0] = (internal)(pVar5.first == 0xffffffffffffffff);
  local_168 = (undefined8 *)0x0;
  if (!(bool)local_170[0]) {
    testing::Message::Message((Message *)&local_180);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_158,(internal *)local_170,
               (AssertionResult *)"ht_in.count(this->UniqueKey(56))","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4c7,(char *)CONCAT44(local_158._M_dataplus._M_p._4_4_,
                                       (int)local_158._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_160,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_158._M_dataplus._M_p._4_4_,(int)local_158._M_dataplus._M_p) !=
        &local_158.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_158._M_dataplus._M_p._4_4_,(int)local_158._M_dataplus._M_p));
    }
    if ((pair<int,_int>)local_180._0_8_ != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_180._0_8_ + 8))();
    }
    puVar1 = local_168;
    if (local_168 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_168 != local_168 + 2) {
        operator_delete((undefined8 *)*local_168);
      }
      operator_delete(puVar1);
    }
  }
  local_138 = (undefined1  [8])&PTR__BaseHashtableInterface_00c1a0e8;
  if (local_b8 != (pointer)0x0) {
    free(local_b8);
  }
  local_b0.
  super_BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c1a0e8;
  if (local_b0.
      super_BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      .ht_.rep.table != (pointer)0x0) {
    free(local_b0.
         super_BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.rep.table);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Serialization) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  auto fp = tmpfile();
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_out.serialize(ValueSerializer(), fp));
  rewind(fp);

  TypeParam ht_in;
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_in.unserialize(ValueSerializer(), fp));
  fclose(fp);

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}